

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall mp::NLSolver::NLSolver(NLSolver *this)

{
  PreprocessData *in_RDI;
  PreprocessData *this_00;
  allocator<char> *__a;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> local_9 [9];
  
  this_00 = in_RDI;
  NLUtils::NLUtils((NLUtils *)in_RDI);
  (in_RDI->vperm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_RDI;
  std::__cxx11::string::string((string *)&in_RDI->vperm_inv_);
  std::__cxx11::string::string
            ((string *)
             &in_RDI[1].vperm_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish);
  *(undefined1 *)
   &in_RDI[1].vperm_inv_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  std::unique_ptr<mp::NLHeader,std::default_delete<mp::NLHeader>>::
  unique_ptr<std::default_delete<mp::NLHeader>,void>
            ((unique_ptr<mp::NLHeader,_std::default_delete<mp::NLHeader>_> *)this_00);
  NLModel::PreprocessData::PreprocessData(this_00);
  __a = (allocator<char> *)
        &in_RDI[3].vperm_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  __s = local_9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffffe0,(char *)__s,__a);
  std::allocator<char>::~allocator(local_9);
  *(undefined4 *)
   &this_00[4].vperm_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = 0;
  *(undefined4 *)
   ((long)&this_00[4].vperm_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0xffffffff;
  return;
}

Assistant:

NLSolver::NLSolver()
  : p_ut_(&utils_) { }